

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalWatcomWMakeGenerator.cxx
# Opt level: O1

void cmGlobalWatcomWMakeGenerator::GetDocumentation(cmDocumentationEntry *entry)

{
  long *local_38;
  undefined8 local_30;
  long local_28;
  undefined4 local_20;
  undefined1 local_1c;
  
  local_28 = 0x57206d6f63746157;
  local_20 = 0x656b614d;
  local_30 = 0xc;
  local_1c = 0;
  local_38 = &local_28;
  std::__cxx11::string::operator=((string *)entry,(string *)&local_38);
  if (local_38 != &local_28) {
    operator_delete(local_38,local_28 + 1);
  }
  std::__cxx11::string::_M_replace
            ((ulong)&entry->Brief,0,(char *)(entry->Brief)._M_string_length,0x654705);
  return;
}

Assistant:

void cmGlobalWatcomWMakeGenerator::GetDocumentation(
  cmDocumentationEntry& entry)
{
  entry.Name = cmGlobalWatcomWMakeGenerator::GetActualName();
  entry.Brief = "Generates Watcom WMake makefiles.";
}